

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_instance_cache.cpp
# Opt level: O2

string * duckdb::GetDBAbsolutePath(string *__return_storage_ptr__,string *database_p,FileSystem *fs)

{
  bool bVar1;
  long lVar2;
  string database;
  string local_78;
  string local_58;
  string local_38;
  
  FileSystem::ExpandPath(&local_78,database_p,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (local_78._M_string_length == 0) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,":memory:",(allocator *)&local_58);
  }
  else {
    lVar2 = ::std::__cxx11::string::rfind((char *)&local_78,0xf8aaae);
    if (lVar2 != 0) {
      ExtensionHelper::ExtractExtensionPrefixFromPath(&local_58,&local_78);
      ::std::__cxx11::string::~string((string *)&local_58);
      if (local_58._M_string_length == 0) {
        bVar1 = FileSystem::IsPathAbsolute(fs,&local_78);
        if (bVar1) {
          FileSystem::NormalizeAbsolutePath(__return_storage_ptr__,fs,&local_78);
        }
        else {
          FileSystem::GetWorkingDirectory_abi_cxx11_();
          FileSystem::JoinPath(&local_58,fs,&local_38,&local_78);
          FileSystem::NormalizeAbsolutePath(__return_storage_ptr__,fs,&local_58);
          ::std::__cxx11::string::~string((string *)&local_58);
          ::std::__cxx11::string::~string((string *)&local_38);
        }
        goto LAB_0044b1dd;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
LAB_0044b1dd:
  ::std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

string GetDBAbsolutePath(const string &database_p, FileSystem &fs) {
	auto database = FileSystem::ExpandPath(database_p, nullptr);
	if (database.empty()) {
		return IN_MEMORY_PATH;
	}
	if (database.rfind(IN_MEMORY_PATH, 0) == 0) {
		// this is a memory db, just return it.
		return database;
	}
	if (!ExtensionHelper::ExtractExtensionPrefixFromPath(database).empty()) {
		// this database path is handled by a replacement open and is not a file path
		return database;
	}
	if (fs.IsPathAbsolute(database)) {
		return fs.NormalizeAbsolutePath(database);
	}
	return fs.NormalizeAbsolutePath(fs.JoinPath(FileSystem::GetWorkingDirectory(), database));
}